

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

Vec_Ptr_t * Prs_ManReadVerilog(char *pFileName)

{
  Vec_Int_t *p;
  Vec_Int_t *vTemp;
  int *piVar1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint Entry;
  int iVar8;
  int iVar9;
  Prs_Man_t *p_00;
  FILE *__stream;
  long lVar10;
  char *pcVar11;
  Abc_Nam_t *pAVar12;
  Hash_IntMan_t *pHVar13;
  Vec_Ptr_t *pVVar14;
  size_t sVar15;
  Prs_Ntk_t *pPVar16;
  char *pcVar17;
  byte *pbVar18;
  char cVar19;
  uint *puVar20;
  ulong uVar21;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int extraout_EDX_37;
  int extraout_EDX_38;
  int extraout_EDX_39;
  int extraout_EDX_40;
  int extraout_EDX_41;
  int extraout_EDX_42;
  int extraout_EDX_43;
  int extraout_EDX_44;
  int extraout_EDX_45;
  int extraout_EDX_46;
  int extraout_EDX_47;
  int extraout_EDX_48;
  int extraout_EDX_49;
  int extraout_EDX_50;
  int extraout_EDX_51;
  int extraout_EDX_52;
  int extraout_EDX_53;
  int extraout_EDX_54;
  int extraout_EDX_55;
  int extraout_EDX_56;
  int extraout_EDX_57;
  int extraout_EDX_58;
  int extraout_EDX_59;
  int extraout_EDX_60;
  int extraout_EDX_61;
  int extraout_EDX_62;
  int extraout_EDX_63;
  int extraout_EDX_64;
  int extraout_EDX_65;
  int extraout_EDX_66;
  int extraout_EDX_67;
  int Value;
  int extraout_EDX_68;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar22;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  uint uVar23;
  long lVar24;
  char *pcVar25;
  int i;
  undefined1 auVar26 [16];
  int local_94;
  int local_84;
  Vec_Int_t *local_78 [3];
  long lStack_60;
  Vec_Int_t *vSigs [3];
  
  p_00 = (Prs_Man_t *)calloc(1,0x4c0);
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      puts("Cannot open input file.");
      return (Vec_Ptr_t *)0x0;
    }
    fseek(__stream,0,2);
    lVar10 = ftell(__stream);
    rewind(__stream);
    lVar24 = lVar10 << 0x20;
    pcVar11 = (char *)malloc(lVar24 + 0x1000000000 >> 0x20);
    *pcVar11 = '\n';
    fread(pcVar11 + 1,(long)(int)lVar10,1,__stream);
    fclose(__stream);
    pcVar11[lVar24 + 0x100000000 >> 0x20] = '\n';
    pcVar11[lVar24 + 0x200000000 >> 0x20] = '\0';
    p_00->pName = pFileName;
    p_00->pBuffer = pcVar11;
    p_00->pLimit = pcVar11 + (long)(int)lVar10 + 3;
    p_00->pCur = pcVar11;
  }
  pAVar12 = Abc_NamStart(1000,0x18);
  p_00->pStrs = pAVar12;
  iVar4 = 100;
  pAVar12 = Abc_NamStart(100,0x18);
  p_00->pFuns = pAVar12;
  pHVar13 = Hash_IntManStart(iVar4);
  p_00->vHash = pHVar13;
  pVVar14 = Vec_PtrAlloc(100);
  p_00->vNtks = pVVar14;
  Abc_NamStrFindOrAdd(p_00->pFuns,"1\'b0",(int *)0x0);
  Abc_NamStrFindOrAdd(p_00->pFuns,"1\'b1",(int *)0x0);
  Abc_NamStrFindOrAdd(p_00->pFuns,"1\'bx",(int *)0x0);
  Abc_NamStrFindOrAdd(p_00->pFuns,"1\'bz",(int *)0x0);
  Prs_NtkAddVerilogDirectives(p_00);
  p = &p_00->vTemp3;
  vTemp = &p_00->vTemp;
  uVar22 = extraout_RDX;
LAB_00335392:
  while (iVar4 = (int)uVar22, p_00->pNtk == (Prs_Ntk_t *)0x0) {
    while( true ) {
      iVar4 = Prs_ManUtilSkipSpaces(p_00);
      if (iVar4 != 0) {
        p_00->ErrorStr[0] = '\0';
        goto LAB_003362af;
      }
      if (*p_00->pCur != '`') break;
      Prs_ManUtilSkipUntilWord(p_00,"\n");
    }
    iVar4 = Prs_ManReadName(p_00);
    if (iVar4 != 6) {
      pcVar11 = "Cannot read \"module\" keyword.";
      iVar4 = extraout_EDX;
      goto LAB_00336247;
    }
    iVar4 = Prs_ManUtilSkipSpaces(p_00);
    if (iVar4 != 0) goto LAB_003362af;
    iVar4 = Prs_ManReadName(p_00);
    if (iVar4 == 0) {
      pcVar11 = "Cannot read module name.";
      iVar4 = extraout_EDX_00;
      goto LAB_00336247;
    }
    pcVar11 = Abc_NamStr(p_00->pStrs,iVar4);
    lVar10 = 1;
    do {
      if (lVar10 == 0x37) {
        if (p_00->pNtk != (Prs_Ntk_t *)0x0) {
          __assert_fail("p->pNtk == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                        ,0xd7,"void Prs_ManInitializeNtk(Prs_Man_t *, int, int)");
        }
        pPVar16 = (Prs_Ntk_t *)calloc(1,0xf0);
        p_00->pNtk = pPVar16;
        pPVar16->iModuleName = iVar4;
        pPVar16->field_0x4 = 2;
        pAVar12 = Abc_NamRef(p_00->pStrs);
        p_00->pNtk->pStrs = pAVar12;
        pAVar12 = Abc_NamRef(p_00->pFuns);
        pcVar25 = (char *)p_00->pNtk;
        ((Prs_Ntk_t *)pcVar25)->pFuns = pAVar12;
        pHVar13 = p_00->vHash;
        piVar1 = &pHVar13->nRefs;
        *piVar1 = *piVar1 + 1;
        ((Prs_Ntk_t *)pcVar25)->vHash = pHVar13;
        Vec_PtrPush(p_00->vNtks,pcVar25);
        iVar4 = Prs_ManUtilSkipSpaces(p_00);
        if (iVar4 != 0) goto LAB_003362af;
        if (*p_00->pCur != '(') {
          pcVar11 = "Cannot find \"(\" in the argument declaration.";
          iVar4 = extraout_EDX_01;
          goto LAB_00336247;
        }
        pPVar16 = p_00->pNtk;
        vSigs[0] = &pPVar16->vInputs;
        vSigs[1] = &pPVar16->vOutputs;
        vSigs[2] = &pPVar16->vInouts;
        local_78[0] = &pPVar16->vInputsR;
        local_78[1] = &pPVar16->vOutputsR;
        local_78[2] = &pPVar16->vInoutsR;
        p_00->pCur = p_00->pCur + 1;
        iVar5 = Prs_ManUtilSkipSpaces(p_00);
        pcVar11 = "Error number 30.";
        iVar4 = extraout_EDX_02;
        if (iVar5 != 0) goto LAB_00336247;
        pcVar11 = p_00->pCur;
        if (*pcVar11 == ')') goto LAB_00335523;
        local_94 = 0;
        uVar6 = 0xffffffff;
        goto LAB_00335ef7;
      }
      pcVar25 = s_VerNames[lVar10];
      sVar15 = strlen(pcVar25);
      iVar5 = strncmp(pcVar11,pcVar25,(long)(int)sVar15);
      lVar10 = lVar10 + 1;
    } while (iVar5 != 0);
    iVar5 = Prs_ManUtilSkipUntilWord(p_00,"endmodule");
    if (iVar5 != 0) {
      Prs_ManErrorSet(p_00,"Cannot find \"endmodule\" keyword.",Value);
      goto LAB_003362af;
    }
    Vec_IntPush(&p_00->vKnown,iVar4);
    uVar22 = extraout_RDX_12;
  }
  pcVar11 = "Parsing previous module is unfinished.";
LAB_00336247:
  Prs_ManErrorSet(p_00,pcVar11,iVar4);
LAB_003362af:
  Prs_ManPrintModules(p_00);
  if (p_00->ErrorStr[0] == '\0') {
    pVVar14 = p_00->vNtks;
    p_00->vNtks = (Vec_Ptr_t *)0x0;
  }
  else {
    uVar21 = 0;
    for (pcVar11 = p_00->pBuffer; pcVar11 < p_00->pCur; pcVar11 = pcVar11 + 1) {
      uVar21 = (ulong)((int)uVar21 + (uint)(*pcVar11 == '\n'));
    }
    pVVar14 = (Vec_Ptr_t *)0x0;
    printf("Line %d: %s\n",uVar21,p_00->ErrorStr);
  }
  if (p_00->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p_00->pStrs);
  }
  if (p_00->pFuns != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p_00->pFuns);
  }
  if (p_00->vHash != (Hash_IntMan_t *)0x0) {
    Hash_IntManDeref(p_00->vHash);
  }
  if (p_00->vNtks != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(p_00->vNtks);
  }
  pcVar11 = (p_00->vCover).pArray;
  if (pcVar11 != (char *)0x0) {
    free(pcVar11);
    (p_00->vCover).pArray = (char *)0x0;
  }
  (p_00->vCover).nCap = 0;
  (p_00->vCover).nSize = 0;
  Vec_IntErase(vTemp);
  Vec_IntErase(&p_00->vTemp2);
  Vec_IntErase(p);
  Vec_IntErase(&p_00->vTemp4);
  Vec_IntErase(&p_00->vKnown);
  Vec_IntErase(&p_00->vFailed);
  Vec_IntErase(&p_00->vSucceeded);
  free(p_00->pBuffer);
  free(p_00);
  return pVVar14;
LAB_00335ef7:
  cVar19 = *p_00->pCur;
  uVar23 = Prs_ManReadName(p_00);
  if (uVar23 == 0) {
    pcVar11 = "Error number 31.";
    iVar4 = extraout_EDX_57;
    goto LAB_00336247;
  }
  iVar4 = Prs_ManUtilSkipSpaces(p_00);
  if (iVar4 != 0) {
    pcVar11 = "Error number 32.";
    iVar4 = extraout_EDX_58;
    goto LAB_00336247;
  }
  if ((uVar23 < 4) && (cVar19 != '\\')) {
    if (*p_00->pCur == '[') {
      local_94 = Prs_ManReadRange(p_00);
      iVar4 = extraout_EDX_59;
      if (local_94 == 0) {
LAB_003361b4:
        pcVar11 = "Error number 33.";
      }
      else {
        iVar5 = Prs_ManUtilSkipSpaces(p_00);
        iVar4 = extraout_EDX_60;
        if (iVar5 == 0) goto LAB_00335f5e;
LAB_003361c0:
        pcVar11 = "Error number 34.";
      }
      goto LAB_00336247;
    }
LAB_00335f5e:
    uVar7 = Prs_ManReadName(p_00);
    if (uVar7 == 0xf) {
      iVar4 = Prs_ManUtilSkipSpaces(p_00);
      if (iVar4 != 0) {
        pcVar11 = "Error number 32.";
        iVar4 = extraout_EDX_62;
        goto LAB_00336247;
      }
      if (*p_00->pCur == '[') {
        local_94 = Prs_ManReadRange(p_00);
        iVar4 = extraout_EDX_63;
        if (local_94 == 0) goto LAB_003361b4;
        iVar5 = Prs_ManUtilSkipSpaces(p_00);
        iVar4 = extraout_EDX_64;
        if (iVar5 != 0) goto LAB_003361c0;
      }
      uVar7 = Prs_ManReadName(p_00);
      iVar4 = extraout_EDX_65;
      if (uVar7 == 0) goto LAB_00336193;
      iVar4 = 1;
    }
    else {
      iVar4 = extraout_EDX_61;
      if (uVar7 == 0) {
LAB_00336193:
        pcVar11 = "Error number 35.";
        goto LAB_00336247;
      }
      iVar4 = 0;
    }
LAB_00335feb:
    Vec_IntPush(vSigs[uVar23 - 1],uVar7);
    pVVar2 = local_78[uVar23 - 1];
    iVar4 = Abc_Var2Lit(local_94,iVar4);
    Vec_IntPush(pVVar2,iVar4);
    pPVar16 = p_00->pNtk;
    uVar6 = Abc_Var2Lit2(uVar7,uVar23);
    pcVar25 = (char *)(ulong)uVar6;
    Vec_IntPush(&pPVar16->vOrder,uVar6);
    uVar6 = uVar23;
  }
  else {
    iVar4 = 0;
    uVar7 = uVar23;
    uVar23 = uVar6;
    if (0 < (int)uVar6) goto LAB_00335feb;
  }
  iVar5 = Prs_ManUtilSkipSpaces(p_00);
  iVar4 = extraout_EDX_66;
  if (iVar5 != 0) goto LAB_00336106;
  pcVar11 = p_00->pCur;
  if (*pcVar11 == ',') goto code_r0x00336053;
  if (*pcVar11 != ')') {
    pcVar11 = "Expecting comma in the instance.";
    goto LAB_00336247;
  }
LAB_00335523:
  p_00->pCur = pcVar11 + 1;
  iVar4 = Prs_ManUtilSkipSpaces(p_00);
  if (iVar4 != 0) goto LAB_003362af;
  bVar3 = false;
  uVar22 = extraout_RDX_00;
LAB_00335541:
  iVar4 = (int)uVar22;
  if (*p_00->pCur != ';' && !bVar3) {
    pcVar11 = "Cannot find \";\" in the module definition.";
    goto LAB_00336247;
  }
  if (!bVar3) {
    p_00->pCur = p_00->pCur + 1;
  }
  iVar4 = Prs_ManUtilSkipSpaces(p_00);
  if (iVar4 != 0) goto LAB_003362af;
  uVar6 = Prs_ManReadName(p_00);
  cVar19 = (char)pcVar25;
  if (uVar6 == 0x10) goto LAB_00336081;
  if (4 < uVar6 - 1) {
    puVar20 = &switchD_0033578c::switchdataD_007a6730;
    switch(uVar6) {
    case 7:
      uVar6 = Prs_ManReadSignal(p_00);
      iVar4 = (int)extraout_RDX_06;
      uVar22 = extraout_RDX_06;
      while( true ) {
        if (uVar6 == 0) goto LAB_003361e1;
        iVar4 = (int)uVar22;
        if (*p_00->pCur != '=') {
          pcVar11 = "Expecting \"=\" in assign-statement.";
          goto LAB_00336247;
        }
        p_00->pCur = p_00->pCur + 1;
        iVar5 = Prs_ManUtilSkipSpaces(p_00);
        iVar4 = extraout_EDX_13;
        if (iVar5 != 0) goto LAB_00336234;
        pcVar25 = (char *)(ulong)uVar6;
        iVar4 = Prs_ManReadExpression(p_00,uVar6);
        if (iVar4 == 0) goto LAB_003362af;
        cVar19 = *p_00->pCur;
        if (cVar19 != ',') break;
        p_00->pCur = p_00->pCur + 1;
        iVar5 = Prs_ManUtilSkipSpaces(p_00);
        iVar4 = extraout_EDX_14;
        if (iVar5 != 0) goto LAB_00336167;
        uVar6 = Prs_ManReadSignal(p_00);
        iVar4 = (int)extraout_RDX_07;
        uVar22 = extraout_RDX_07;
      }
      if (cVar19 != ';') {
        __assert_fail("Prs_ManIsChar(p, \',\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x4f8,"int Prs_ManReadModule(Prs_Man_t *)");
      }
      break;
    case 8:
      iVar5 = Prs_ManUtilSkipSpaces(p_00);
      iVar4 = extraout_EDX_19;
      if (iVar5 == 0) {
        if (*p_00->pCur == '@') {
          p_00->pCur = p_00->pCur + 1;
          iVar5 = Prs_ManUtilSkipSpaces(p_00);
          iVar4 = extraout_EDX_20;
          if (iVar5 != 0) goto LAB_00336167;
          if (*p_00->pCur == '(') {
            pcVar11 = Prs_ManFindClosingParenthesis(p_00,cVar19,(char)extraout_EDX_20);
            iVar4 = extraout_EDX_21;
            if (pcVar11 == (char *)0x0) {
              pcVar11 = "Expecting closing parenthesis 1.";
              goto LAB_00336247;
            }
            p_00->pCur = pcVar11;
            if (*pcVar11 == ')') {
              p_00->pCur = pcVar11 + 1;
              iVar5 = Prs_ManUtilSkipSpaces(p_00);
              iVar4 = extraout_EDX_22;
              if (iVar5 == 0) {
                iVar4 = Prs_ManReadName(p_00);
                if (iVar4 != 0xb) {
                  pcVar11 = "Cannot read \"begin\" keyword.";
                  iVar4 = extraout_EDX_23;
                  goto LAB_00336247;
                }
                iVar5 = Prs_ManUtilSkipSpaces(p_00);
                iVar4 = extraout_EDX_24;
                if (iVar5 == 0) {
                  iVar4 = Prs_ManReadName(p_00);
                  if (iVar4 != 0xd) {
                    pcVar11 = "Cannot read \"case\" keyword.";
                    iVar4 = extraout_EDX_25;
                    goto LAB_00336247;
                  }
                  iVar5 = Prs_ManUtilSkipSpaces(p_00);
                  iVar4 = extraout_EDX_26;
                  if (iVar5 == 0) {
                    if (*p_00->pCur != '(') goto LAB_003361ea;
                    p_00->pCur = p_00->pCur + 1;
                    iVar5 = Prs_ManUtilSkipSpaces(p_00);
                    iVar4 = extraout_EDX_27;
                    if (iVar5 == 0) {
                      iVar5 = Prs_ManReadSignal(p_00);
                      iVar4 = extraout_EDX_28;
                      if (iVar5 == 0) {
LAB_003361e1:
                        pcVar11 = "Cannot read output in assign-statement.";
                        goto LAB_00336247;
                      }
                      iVar8 = Prs_ManUtilSkipSpaces(p_00);
                      iVar4 = extraout_EDX_29;
                      if (iVar8 == 0) {
                        if (*p_00->pCur != ')') goto LAB_003361ea;
                        p_00->pCur = p_00->pCur + 1;
                        (p_00->vTemp3).nSize = 0;
                        Vec_IntPushTwo(p,0,0);
                        Vec_IntPushTwo(p,0,iVar5);
                        iVar5 = Prs_ManUtilSkipSpaces(p_00);
                        iVar4 = extraout_EDX_30;
                        if (iVar5 == 0) {
                          pbVar18 = (byte *)p_00->pCur;
                          uVar21 = CONCAT71((int7)((ulong)puVar20 >> 8),*pbVar18);
                          iVar4 = (int)uVar21 + -0x3a;
                          if ((byte)iVar4 < 0xf6) goto LAB_003361ea;
                          while (0xf5 < (byte)((char)uVar21 - 0x3aU)) {
                            while (pbVar18 = pbVar18 + 1, 0xf5 < (byte)((char)uVar21 - 0x3aU)) {
                              p_00->pCur = (char *)pbVar18;
                              uVar21 = (ulong)*pbVar18;
                            }
                            iVar5 = Prs_ManUtilSkipSpaces(p_00);
                            iVar4 = extraout_EDX_31;
                            if (iVar5 != 0) goto LAB_00336167;
                            if (*p_00->pCur != ':') goto LAB_003361ea;
                            p_00->pCur = p_00->pCur + 1;
                            iVar5 = Prs_ManUtilSkipSpaces(p_00);
                            iVar4 = extraout_EDX_32;
                            if (iVar5 != 0) goto LAB_00336167;
                            iVar5 = Prs_ManReadSignal(p_00);
                            iVar4 = extraout_EDX_33;
                            if (iVar5 == 0) goto LAB_003361e1;
                            iVar8 = Prs_ManUtilSkipSpaces(p_00);
                            iVar4 = extraout_EDX_34;
                            if (iVar8 != 0) goto LAB_00336167;
                            if (*p_00->pCur != '=') goto LAB_003361ea;
                            p_00->pCur = p_00->pCur + 1;
                            Vec_IntWriteEntry(p,1,iVar5);
                            iVar5 = Prs_ManReadSignal(p_00);
                            iVar4 = extraout_EDX_35;
                            if (iVar5 == 0) goto LAB_003361e1;
                            iVar8 = Prs_ManUtilSkipSpaces(p_00);
                            iVar4 = extraout_EDX_36;
                            if (iVar8 != 0) goto LAB_00336167;
                            if (*p_00->pCur != ';') goto LAB_003361ea;
                            p_00->pCur = p_00->pCur + 1;
                            iVar8 = Prs_ManUtilSkipSpaces(p_00);
                            iVar4 = extraout_EDX_37;
                            if (iVar8 != 0) goto LAB_00336167;
                            Vec_IntPushTwo(p,0,iVar5);
                            pbVar18 = (byte *)p_00->pCur;
                            uVar21 = (ulong)*pbVar18;
                          }
                          iVar5 = Prs_ManUtilSkipSpaces(p_00);
                          iVar4 = extraout_EDX_53;
                          if (iVar5 == 0) {
                            iVar4 = Prs_ManReadName(p_00);
                            if (iVar4 != 0xe) {
                              pcVar11 = "Cannot read \"endcase\" keyword.";
                              iVar4 = extraout_EDX_54;
                              goto LAB_00336247;
                            }
                            iVar5 = Prs_ManUtilSkipSpaces(p_00);
                            iVar4 = extraout_EDX_55;
                            if (iVar5 == 0) {
                              iVar4 = Prs_ManReadName(p_00);
                              if (iVar4 == 0xc) {
                                pcVar25 = (char *)0x28;
                                Prs_NtkAddBox(p_00->pNtk,0x28,0,p);
                                bVar3 = true;
                                goto LAB_00335e78;
                              }
                              pcVar11 = "Cannot read \"end\" keyword.";
                              iVar4 = extraout_EDX_56;
                              goto LAB_00336247;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_00336167:
              pcVar11 = "Error number 23a.";
              goto LAB_00336247;
            }
          }
        }
LAB_003361ea:
        pcVar11 = "Cannot parse always statement.";
      }
      else {
LAB_00336234:
        pcVar11 = "Error number 23.";
      }
      goto LAB_00336247;
    case 9:
      p_00->FuncNameId = 0;
      p_00->FuncRangeId = 0;
      iVar5 = Prs_ManUtilSkipUntilWord(p_00,"_func_");
      pcVar11 = "Cannot find \"_func_\" keyword.";
      iVar4 = extraout_EDX_15;
      if (iVar5 != 0) goto LAB_00336247;
      p_00->pCur = p_00->pCur + -6;
      iVar4 = Prs_ManReadName(p_00);
      p_00->FuncNameId = iVar4;
      if (iVar4 == 0) {
        pcVar11 = "Error number 30a.";
        iVar4 = extraout_EDX_16;
      }
      else {
        iVar5 = Prs_ManUtilSkipUntilWord(p_00,"input");
        pcVar11 = "Cannot find \"input\" keyword.";
        iVar4 = extraout_EDX_17;
        if (iVar5 != 0) goto LAB_00336247;
        iVar4 = Prs_ManUtilSkipSpaces(p_00);
        if (iVar4 == 0) {
          if (*p_00->pCur == '[') {
LAB_0033590c:
            iVar4 = Prs_ManReadRange(p_00);
            p_00->FuncRangeId = iVar4;
          }
          else {
            iVar4 = Prs_ManReadName(p_00);
            if (iVar4 == 0xf) {
              iVar4 = Prs_ManUtilSkipSpaces(p_00);
              if (iVar4 != 0) {
                pcVar11 = "Error number 30c.";
                iVar4 = extraout_EDX_49;
                goto LAB_00336247;
              }
              if (*p_00->pCur == '[') goto LAB_0033590c;
            }
          }
          pcVar25 = "endfunction";
          iVar4 = Prs_ManUtilSkipUntilWord(p_00,"endfunction");
          bVar3 = true;
          if (iVar4 == 0) goto LAB_00335e78;
          pcVar11 = "Cannot find \"endfunction\" keyword.";
          iVar4 = extraout_EDX_50;
          goto LAB_00336247;
        }
        pcVar11 = "Error number 30b.";
        iVar4 = extraout_EDX_18;
      }
      goto LAB_00336247;
    case 10:
      while( true ) {
        if (p_00->pLimit <= p_00->pCur) goto LAB_003362af;
        if (*p_00->pCur == ';') break;
        iVar4 = Prs_ManUtilSkipComments(p_00);
        if (iVar4 == 0) {
          pcVar11 = p_00->pCur;
          if (*pcVar11 == '\\') {
            pcVar11 = pcVar11 + 1;
            do {
              p_00->pCur = pcVar11;
              if (p_00->pLimit <= pcVar11) goto LAB_0033596e;
              pcVar17 = pcVar11 + 1;
              cVar19 = *pcVar11;
              pcVar11 = pcVar17;
            } while (cVar19 != ' ');
          }
          else {
LAB_0033596e:
            pcVar17 = pcVar11 + 1;
          }
          p_00->pCur = pcVar17;
        }
      }
      break;
    default:
      iVar5 = Prs_ManUtilSkipSpaces(p_00);
      iVar4 = extraout_EDX_38;
      if (iVar5 == 0) {
        pcVar11 = p_00->pCur;
        if (*pcVar11 == '#') {
          do {
            pcVar11 = pcVar11 + 1;
            p_00->pCur = pcVar11;
          } while (0xf5 < (byte)(*pcVar11 - 0x3aU));
          iVar5 = Prs_ManUtilSkipSpaces(p_00);
          iVar4 = extraout_EDX_39;
          if (iVar5 != 0) goto LAB_00336260;
        }
        iVar5 = Prs_ManReadName(p_00);
        iVar4 = extraout_EDX_40;
        if ((iVar5 != 0) &&
           (iVar8 = Prs_ManUtilSkipSpaces(p_00), iVar4 = extraout_EDX_41, iVar8 != 0)) {
          pcVar11 = "Error number 26.";
          goto LAB_003362a2;
        }
        if (*p_00->pCur == '(') {
          p_00->pCur = p_00->pCur + 1;
          iVar4 = Prs_ManUtilSkipSpaces(p_00);
          if (iVar4 == 0) {
            pcVar11 = p_00->pCur;
            if (*pcVar11 == '.') {
              (p_00->vTemp).nSize = 0;
              if (*pcVar11 != '.') {
                __assert_fail("Prs_ManIsChar(p, \'.\')",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                              ,0x284,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
              }
LAB_00335c64:
              pcVar11 = p_00->pCur;
              cVar19 = *pcVar11;
              if (cVar19 == '.') {
                p_00->pCur = pcVar11 + 1;
                iVar4 = Prs_ManReadName(p_00);
                if (iVar4 == 0) {
                  pcVar11 = "Cannot read formal name of the instance.";
                  iVar8 = extraout_EDX_43;
                  goto LAB_00336293;
                }
                iVar9 = Prs_ManUtilSkipSpaces(p_00);
                iVar8 = extraout_EDX_44;
                if (iVar9 != 0) {
LAB_00336257:
                  pcVar11 = "Error number 17.";
                  goto LAB_00336293;
                }
                if (*p_00->pCur != '(') {
                  pcVar11 = "Cannot read \"(\" in the instance.";
                  goto LAB_00336293;
                }
                p_00->pCur = p_00->pCur + 1;
                iVar9 = Prs_ManUtilSkipSpaces(p_00);
                iVar8 = extraout_EDX_45;
                if (iVar9 != 0) goto LAB_00336257;
                iVar9 = Prs_ManReadSignal(p_00);
                iVar8 = extraout_EDX_46;
                if (iVar9 == 0) {
                  pcVar11 = "Cannot read actual name of an instance.";
                  goto LAB_00336293;
                }
                if (*p_00->pCur != ')') {
                  pcVar11 = "Cannot read \")\" in the instance.";
                  goto LAB_00336293;
                }
                p_00->pCur = p_00->pCur + 1;
                if (iVar9 != 1) {
                  Vec_IntPushTwo(vTemp,iVar4,iVar9);
                }
                iVar4 = Prs_ManUtilSkipSpaces(p_00);
                iVar8 = extraout_EDX_47;
                if (iVar4 != 0) {
                  pcVar11 = "Error number 18.";
                  goto LAB_00336293;
                }
                pcVar11 = p_00->pCur;
                cVar19 = *pcVar11;
                if (cVar19 == ',') goto code_r0x00335d1d;
                if (cVar19 != ')') {
                  pcVar11 = "Expecting comma in the instance.";
                  goto LAB_00336293;
                }
              }
              uVar23 = (p_00->vTemp).nSize;
              if ((int)uVar23 < 1) {
                __assert_fail("Vec_IntSize(vTemp) > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                              ,0x29a,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
              }
              if ((uVar23 & 1) != 0) {
                __assert_fail("Vec_IntSize(vTemp) % 2 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                              ,0x29b,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
              }
            }
            else {
              pcVar11 = Abc_NamStr(p_00->pStrs,uVar6);
              lVar10 = -0x10;
              uVar22 = extraout_RDX_08;
              do {
                lVar24 = lVar10;
                iVar4 = (int)uVar22;
                if (lVar24 + 0x10 == 0x90) goto LAB_0033621a;
                iVar8 = strcmp(pcVar11,*(char **)((long)&s_VerilogPrims[1].pName + lVar24));
                iVar4 = (int)extraout_RDX_09;
                lVar10 = lVar24 + 0x10;
                uVar22 = extraout_RDX_09;
              } while (iVar8 != 0);
              uVar6 = *(uint *)((long)&s_VerilogPrims[1].Type + lVar24);
              if (uVar6 == 0) {
LAB_0033621a:
                Prs_ManErrorSet(p_00,"Cannot find elementary gate.",iVar4);
                goto LAB_003362af;
              }
              iVar8 = Prs_ManReadSignalList(p_00,vTemp,')',1);
              iVar4 = extraout_EDX_51;
              if (iVar8 == 0) {
LAB_0033629b:
                pcVar11 = "Error number 28.";
                goto LAB_003362a2;
              }
              pcVar11 = p_00->pCur;
              cVar19 = *pcVar11;
            }
            if (cVar19 != ')') {
              __assert_fail("Prs_ManIsChar(p, \')\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x46a,"int Prs_ManReadInstance(Prs_Man_t *, int)");
            }
            p_00->pCur = pcVar11 + 1;
            iVar8 = Prs_ManUtilSkipSpaces(p_00);
            iVar4 = extraout_EDX_52;
            if (iVar8 == 0) {
              if (*p_00->pCur == ';') {
                pcVar25 = (char *)(ulong)uVar6;
                Prs_NtkAddBox(p_00->pNtk,uVar6,iVar5,vTemp);
                bVar3 = false;
                goto LAB_00335e78;
              }
              pcVar11 = "Expecting semicolon in the instance.";
            }
            else {
              pcVar11 = "Error number 29.";
            }
          }
          else {
            pcVar11 = "Error number 27.";
            iVar4 = extraout_EDX_42;
          }
        }
        else {
          pcVar11 = "Expecting \"(\" in module instantiation.";
        }
      }
      else {
LAB_00336260:
        pcVar11 = "Error number 25.";
      }
      goto LAB_003362a2;
    }
    bVar3 = false;
LAB_00335e78:
    iVar4 = Prs_ManUtilSkipSpaces(p_00);
    uVar22 = extraout_RDX_10;
    if (iVar4 != 0) goto LAB_003362af;
    goto LAB_00335541;
  }
  if (uVar6 == 5) {
    uVar6 = 4;
  }
  pPVar16 = p_00->pNtk;
  auVar26._8_4_ = (int)pPVar16;
  auVar26._0_8_ = pPVar16;
  auVar26._12_4_ = (int)((ulong)pPVar16 >> 0x20);
  lStack_60 = auVar26._8_8_;
  vSigs[0] = &pPVar16->vInputs;
  vSigs[1] = (Vec_Int_t *)(lStack_60 + 0x50);
  vSigs[2] = &pPVar16->vInouts;
  local_78[0] = &pPVar16->vInputsR;
  local_78[1] = (Vec_Int_t *)(lStack_60 + 0x90);
  local_78[2] = &pPVar16->vInoutsR;
  lStack_60 = lStack_60 + 0xa0;
  uVar23 = uVar6 - 1;
  if (3 < uVar23) {
    __assert_fail("Type >= PRS_VER_INPUT && Type <= PRS_VER_WIRE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x41b,"int Prs_ManReadDeclaration(Prs_Man_t *, int)");
  }
  iVar5 = Prs_ManUtilSkipSpaces(p_00);
  iVar4 = extraout_EDX_03;
  if (iVar5 == 0) {
    local_84 = 0;
    local_94 = 0;
    if ((*p_00->pCur == '[') &&
       (local_94 = Prs_ManReadRange(p_00), iVar4 = extraout_EDX_04, local_94 == 0)) {
LAB_0033624e:
      pcVar11 = "Error number 21.";
    }
    else {
      uVar7 = Prs_ManReadName(p_00);
      uVar22 = extraout_RDX_01;
      if (uVar7 == 0xf) {
        iVar5 = Prs_ManUtilSkipSpaces(p_00);
        iVar4 = extraout_EDX_05;
        if (iVar5 != 0) goto LAB_003361d5;
        if ((*p_00->pCur == '[') &&
           (local_94 = Prs_ManReadRange(p_00), iVar4 = extraout_EDX_06, local_94 == 0))
        goto LAB_0033624e;
        uVar7 = Prs_ManReadName(p_00);
        local_84 = 1;
        uVar22 = extraout_RDX_02;
      }
      if (uVar7 == 4) {
        iVar5 = Prs_ManUtilSkipSpaces(p_00);
        iVar4 = extraout_EDX_07;
        if (iVar5 != 0) goto LAB_003361d5;
        if ((*p_00->pCur == '[') &&
           (local_94 = Prs_ManReadRange(p_00), iVar4 = extraout_EDX_08, local_94 == 0))
        goto LAB_0033624e;
        uVar7 = Prs_ManReadName(p_00);
        uVar22 = extraout_RDX_03;
      }
      (p_00->vTemp3).nSize = 0;
      while( true ) {
        do {
          Entry = uVar7;
          iVar4 = (int)uVar22;
          if (Entry == 0) {
            pcVar11 = "Cannot read name in the list.";
            goto LAB_003362a2;
          }
          iVar5 = Prs_ManUtilSkipSpaces(p_00);
          iVar4 = (int)extraout_RDX_04;
          if (iVar5 != 0) {
            pcVar11 = "Error number 22a";
            goto LAB_003362a2;
          }
          uVar22 = extraout_RDX_04;
          uVar7 = 4;
        } while (Entry == 4);
        pcVar25 = (char *)(ulong)Entry;
        Vec_IntPush(p,Entry);
        pcVar11 = p_00->pCur;
        cVar19 = *pcVar11;
        iVar4 = extraout_EDX_09;
        if (cVar19 == '=') {
          if (uVar6 == 1) {
            pcVar11 = "Input cannot be defined";
            goto LAB_003362a2;
          }
          p_00->pCur = pcVar11 + 1;
          iVar4 = Prs_ManUtilSkipSpaces(p_00);
          if (iVar4 != 0) {
            pcVar11 = "Error number 23.";
            iVar4 = extraout_EDX_10;
            goto LAB_003362a2;
          }
          pcVar25 = (char *)(ulong)(Entry << 2);
          iVar4 = Prs_ManReadExpression(p_00,Entry << 2);
          if (iVar4 == 0) goto LAB_003362af;
          pcVar11 = p_00->pCur;
          cVar19 = *pcVar11;
          iVar4 = extraout_EDX_11;
        }
        if (cVar19 != ',') break;
        p_00->pCur = pcVar11 + 1;
        iVar4 = Prs_ManUtilSkipSpaces(p_00);
        if (iVar4 != 0) {
          pcVar11 = "Error number 22b.";
          iVar4 = extraout_EDX_12;
          goto LAB_003362a2;
        }
        uVar7 = Prs_ManReadName(p_00);
        uVar22 = extraout_RDX_05;
      }
      if (cVar19 == ';') {
        for (iVar4 = 0; iVar4 < (p_00->vTemp3).nSize; iVar4 = iVar4 + 1) {
          iVar5 = Vec_IntEntry(p,iVar4);
          Vec_IntPush(vSigs[uVar23],iVar5);
          pVVar2 = local_78[uVar23];
          uVar7 = Abc_Var2Lit(local_94,local_84);
          pcVar25 = (char *)(ulong)uVar7;
          Vec_IntPush(pVVar2,uVar7);
          if ((int)uVar6 < 4) {
            pPVar16 = p_00->pNtk;
            uVar7 = Abc_Var2Lit2(iVar5,uVar6);
            pcVar25 = (char *)(ulong)uVar7;
            Vec_IntPush(&pPVar16->vOrder,uVar7);
          }
        }
        bVar3 = false;
        goto LAB_00335e78;
      }
      pcVar11 = "Expecting comma in the list.";
    }
  }
  else {
LAB_003361d5:
    pcVar11 = "Error number 20.";
  }
LAB_003362a2:
  Prs_ManErrorSet(p_00,pcVar11,iVar4);
  goto LAB_003362af;
code_r0x00336053:
  p_00->pCur = pcVar11 + 1;
  iVar5 = Prs_ManUtilSkipSpaces(p_00);
  iVar4 = extraout_EDX_67;
  if (iVar5 != 0) {
LAB_00336106:
    pcVar11 = "Error number 36.";
    goto LAB_00336247;
  }
  goto LAB_00335ef7;
LAB_00336081:
  Vec_IntPush(&p_00->vSucceeded,p_00->pNtk->iModuleName);
  if (p_00->pNtk == (Prs_Ntk_t *)0x0) {
    __assert_fail("p->pNtk != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                  ,0xe2,"void Prs_ManFinalizeNtk(Prs_Man_t *)");
  }
  p_00->pNtk = (Prs_Ntk_t *)0x0;
  uVar22 = extraout_RDX_11;
  goto LAB_00335392;
code_r0x00335d1d:
  p_00->pCur = pcVar11 + 1;
  iVar4 = Prs_ManUtilSkipSpaces(p_00);
  if (iVar4 != 0) {
    pcVar11 = "Error number 19.";
    iVar8 = extraout_EDX_48;
LAB_00336293:
    Prs_ManErrorSet(p_00,pcVar11,iVar8);
    iVar4 = extraout_EDX_68;
    goto LAB_0033629b;
  }
  goto LAB_00335c64;
}

Assistant:

Vec_Ptr_t * Prs_ManReadVerilog( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b0", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b1", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bx", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bz", NULL );
    Prs_NtkAddVerilogDirectives( p );
    Prs_ManReadDesign( p );   
    Prs_ManPrintModules( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}